

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O2

bool __thiscall
duckdb::Iterator::Scan
          (Iterator *this,ARTKey *upper_bound,idx_t max_count,unsafe_vector<row_t> *row_ids,
          bool equal)

{
  Node *node;
  bool bVar1;
  ulong uVar2;
  InternalException *this_00;
  uint uVar3;
  uint8_t byte;
  uint local_64;
  ARTKey *local_60;
  ulong local_58;
  ARTKey key;
  
  node = &this->last_leaf;
  local_64 = (uint)equal;
  local_60 = upper_bound;
  do {
    if ((local_60->len != 0) &&
       (((this->status == GATE_NOT_SET || (this->entered_nested_leaf == true)) &&
        (bVar1 = IteratorKey::GreaterThan
                           (&this->current_key,local_60,SUB41(local_64,0),this->nested_depth), bVar1
        )))) {
      return true;
    }
    uVar2 = (node->super_IndexPointer).data;
    uVar3 = (byte)(uVar2 >> 0x38) & 0x7f;
    if (uVar3 - 8 < 3) {
      byte = '\0';
      while (bVar1 = Node::GetNextByte(node,this->art,&byte), bVar1) {
        if (max_count <
            ((long)(row_ids->super_vector<long,_std::allocator<long>_>).
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_finish -
             (long)(row_ids->super_vector<long,_std::allocator<long>_>).
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start >> 3) + 1U) {
          return false;
        }
        this->row_id[7] = byte;
        ARTKey::ARTKey(&key,this->row_id,8);
        uVar2 = *(ulong *)key.data ^ 0x80;
        local_58 = *(ulong *)key.data >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                   (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                   (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28
                   | uVar2 << 0x38;
        ::std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  (&row_ids->super_vector<long,_std::allocator<long>_>,(long *)&local_58);
        if (byte == 0xff) break;
        byte = byte + '\x01';
      }
    }
    else if (uVar3 == 2) {
      bVar1 = Leaf::DeprecatedGetRowIds(this->art,node,row_ids,max_count);
      if (!bVar1) {
        return false;
      }
    }
    else {
      if (uVar3 != 7) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&key,"Invalid leaf type for index scan.",(allocator *)&local_58);
        InternalException::InternalException(this_00,(string *)&key);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (max_count <
          ((long)(row_ids->super_vector<long,_std::allocator<long>_>).
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(row_ids->super_vector<long,_std::allocator<long>_>).
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start >> 3) + 1U) {
        return false;
      }
      key.len = uVar2 & 0xffffffffffffff;
      ::std::vector<long,_std::allocator<long>_>::emplace_back<long>
                (&row_ids->super_vector<long,_std::allocator<long>_>,(long *)&key);
    }
    this->entered_nested_leaf = false;
    bVar1 = Next(this);
    if (!bVar1) {
      return true;
    }
  } while( true );
}

Assistant:

bool Iterator::Scan(const ARTKey &upper_bound, const idx_t max_count, unsafe_vector<row_t> &row_ids, const bool equal) {
	bool has_next;
	do {
		// An empty upper bound indicates that no upper bound exists.
		if (!upper_bound.Empty()) {
			if (status == GateStatus::GATE_NOT_SET || entered_nested_leaf) {
				if (current_key.GreaterThan(upper_bound, equal, nested_depth)) {
					return true;
				}
			}
		}

		switch (last_leaf.GetType()) {
		case NType::LEAF_INLINED:
			if (row_ids.size() + 1 > max_count) {
				return false;
			}
			row_ids.push_back(last_leaf.GetRowId());
			break;
		case NType::LEAF:
			if (!Leaf::DeprecatedGetRowIds(art, last_leaf, row_ids, max_count)) {
				return false;
			}
			break;
		case NType::NODE_7_LEAF:
		case NType::NODE_15_LEAF:
		case NType::NODE_256_LEAF: {
			uint8_t byte = 0;
			while (last_leaf.GetNextByte(art, byte)) {
				if (row_ids.size() + 1 > max_count) {
					return false;
				}
				row_id[ROW_ID_SIZE - 1] = byte;
				ARTKey key(&row_id[0], ROW_ID_SIZE);
				row_ids.push_back(key.GetRowId());
				if (byte == NumericLimits<uint8_t>::Maximum()) {
					break;
				}
				byte++;
			}
			break;
		}
		default:
			throw InternalException("Invalid leaf type for index scan.");
		}

		entered_nested_leaf = false;
		has_next = Next();
	} while (has_next);
	return true;
}